

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

int sha1_result(sha1_context *context,uint8_t *Message_Digest)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  
  iVar4 = 1;
  if ((Message_Digest != (uint8_t *)0x0 && context != (sha1_context *)0x0) &&
     (iVar4 = context->corrupted, iVar4 == 0)) {
    if (context->computed == 0) {
      lVar5 = (long)context->message_block_index;
      sVar3 = context->message_block_index + 1;
      context->message_block_index = sVar3;
      if (lVar5 < 0x38) {
        context->message_block[lVar5] = 0x80;
        sVar3 = context->message_block_index;
        while (sVar3 < 0x38) {
          context->message_block_index = sVar3 + 1;
          context->message_block[sVar3] = '\0';
          sVar3 = context->message_block_index;
        }
      }
      else {
        context->message_block[lVar5] = 0x80;
        while (sVar3 < 0x40) {
          context->message_block_index = sVar3 + 1;
          context->message_block[sVar3] = '\0';
          sVar3 = context->message_block_index;
        }
        sha1_process_message_block(context);
        sVar3 = context->message_block_index;
        while (sVar3 < 0x38) {
          context->message_block_index = sVar3 + 1;
          context->message_block[sVar3] = '\0';
          sVar3 = context->message_block_index;
        }
      }
      uVar1 = context->length_low;
      uVar2 = context->length_high;
      *(uint *)(context->message_block + 0x38) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *(uint *)(context->message_block + 0x3c) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      sha1_process_message_block(context);
      context->message_block[0x30] = '\0';
      context->message_block[0x31] = '\0';
      context->message_block[0x32] = '\0';
      context->message_block[0x33] = '\0';
      context->message_block[0x34] = '\0';
      context->message_block[0x35] = '\0';
      context->message_block[0x36] = '\0';
      context->message_block[0x37] = '\0';
      context->message_block[0x38] = '\0';
      context->message_block[0x39] = '\0';
      context->message_block[0x3a] = '\0';
      context->message_block[0x3b] = '\0';
      context->message_block[0x3c] = '\0';
      context->message_block[0x3d] = '\0';
      context->message_block[0x3e] = '\0';
      context->message_block[0x3f] = '\0';
      context->message_block[0x20] = '\0';
      context->message_block[0x21] = '\0';
      context->message_block[0x22] = '\0';
      context->message_block[0x23] = '\0';
      context->message_block[0x24] = '\0';
      context->message_block[0x25] = '\0';
      context->message_block[0x26] = '\0';
      context->message_block[0x27] = '\0';
      context->message_block[0x28] = '\0';
      context->message_block[0x29] = '\0';
      context->message_block[0x2a] = '\0';
      context->message_block[0x2b] = '\0';
      context->message_block[0x2c] = '\0';
      context->message_block[0x2d] = '\0';
      context->message_block[0x2e] = '\0';
      context->message_block[0x2f] = '\0';
      context->message_block[0x10] = '\0';
      context->message_block[0x11] = '\0';
      context->message_block[0x12] = '\0';
      context->message_block[0x13] = '\0';
      context->message_block[0x14] = '\0';
      context->message_block[0x15] = '\0';
      context->message_block[0x16] = '\0';
      context->message_block[0x17] = '\0';
      context->message_block[0x18] = '\0';
      context->message_block[0x19] = '\0';
      context->message_block[0x1a] = '\0';
      context->message_block[0x1b] = '\0';
      context->message_block[0x1c] = '\0';
      context->message_block[0x1d] = '\0';
      context->message_block[0x1e] = '\0';
      context->message_block[0x1f] = '\0';
      context->message_block[0] = '\0';
      context->message_block[1] = '\0';
      context->message_block[2] = '\0';
      context->message_block[3] = '\0';
      context->message_block[4] = '\0';
      context->message_block[5] = '\0';
      context->message_block[6] = '\0';
      context->message_block[7] = '\0';
      context->message_block[8] = '\0';
      context->message_block[9] = '\0';
      context->message_block[10] = '\0';
      context->message_block[0xb] = '\0';
      context->message_block[0xc] = '\0';
      context->message_block[0xd] = '\0';
      context->message_block[0xe] = '\0';
      context->message_block[0xf] = '\0';
      context->length_low = 0;
      context->length_high = 0;
      context->computed = 1;
    }
    iVar4 = 0;
    bVar6 = 0;
    lVar5 = 0;
    do {
      Message_Digest[lVar5] =
           (uint8_t)(*(uint *)((long)context->intermediate_hash + (ulong)((uint)lVar5 & 0xfffffffc))
                    >> (~bVar6 & 0x18));
      lVar5 = lVar5 + 1;
      bVar6 = bVar6 + 8;
    } while (lVar5 != 0x14);
  }
  return iVar4;
}

Assistant:

int sha1_result(sha1_context *context,
                uint8_t Message_Digest[SHA1_HASH_SIZE])
{
	if ((!context) || (!Message_Digest)) {
		return SHA_NULL;
	}

	if (context->corrupted) {
		return context->corrupted;
	}

	if (!context->computed) {
		sha1_pad_message(context);
		for (uint_fast8_t i = 0; i < 64; ++i) {
			/* message may be sensitive, clear it out */
			context->message_block[i] = 0;
		}
		context->length_low = 0; /* and clear length */
		context->length_high = 0;
		context->computed = 1;
	}

	for (uint_fast8_t i = 0; i < SHA1_HASH_SIZE; ++i) {
		Message_Digest[i] = (uint8_t)(context->intermediate_hash[i >> 2U] >> 8 * (3 - (i & 0x03U)));
	}

	return SHA_SUCCESS;
}